

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O1

void TTD::NSSnapObjects::
     ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  uint32 *puVar3;
  TTD_PTR_ID TVar4;
  uchar *puVar5;
  ulong uVar6;
  
  puVar3 = (uint32 *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  uVar1 = FileReader::ReadUInt32(reader,numberOfArgs,true);
  *puVar3 = uVar1;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  *(char *)(puVar3 + 1) = (char)iVar2;
  TVar4 = FileReader::ReadAddr(reader,objectId,true);
  *(TTD_PTR_ID *)(puVar3 + 2) = TVar4;
  uVar1 = FileReader::ReadLengthValue(reader,true);
  puVar3[4] = uVar1;
  if (uVar1 == 0) {
    puVar5 = (uchar *)0x0;
  }
  else {
    puVar5 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>(alloc,(ulong)uVar1);
  }
  *(uchar **)(puVar3 + 6) = puVar5;
  (*reader->_vptr_FileReader[3])(reader,0x48,1);
  (*reader->_vptr_FileReader[4])(reader,0);
  if (puVar3[4] != 0) {
    uVar6 = 0;
    do {
      iVar2 = (*reader->_vptr_FileReader[9])(reader,(ulong)(uVar6 != 0));
      *(char *)(*(long *)(puVar3 + 6) + uVar6) = (char)iVar2;
      uVar6 = uVar6 + 1;
    } while (uVar6 < puVar3[4]);
  }
  (*reader->_vptr_FileReader[5])(reader);
  if (snpObject->SnapObjectTag == SnapES5HeapArgumentsObject) {
    snpObject->AddtlSnapObjectInfo = puVar3;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapHeapArgumentsInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapHeapArgumentsInfo* argsInfo = alloc.SlabAllocateStruct<SnapHeapArgumentsInfo>();

            argsInfo->NumOfArguments = reader->ReadUInt32(NSTokens::Key::numberOfArgs, true);

            argsInfo->IsFrameNullPtr = reader->ReadBool(NSTokens::Key::boolVal, true);
            argsInfo->FrameObject = reader->ReadAddr(NSTokens::Key::objectId, true);

            argsInfo->FormalCount = reader->ReadLengthValue(true);

            if(argsInfo->FormalCount == 0)
            {
                argsInfo->DeletedArgFlags = nullptr;
            }
            else
            {
                argsInfo->DeletedArgFlags = alloc.SlabAllocateArray<byte>(argsInfo->FormalCount);
            }

            reader->ReadKey(NSTokens::Key::deletedArgs, true);
            reader->ReadSequenceStart();
            for(uint32 i = 0; i < argsInfo->FormalCount; ++i)
            {
                argsInfo->DeletedArgFlags[i] = reader->ReadNakedByte(i != 0);
            }
            reader->ReadSequenceEnd();

            SnapObjectSetAddtlInfoAs<SnapHeapArgumentsInfo*, argsKind>(snpObject, argsInfo);
        }